

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::impl::get_displacements<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counts)

{
  unsigned_long uVar1;
  iterator iVar2;
  bool bVar3;
  reference puVar4;
  unsigned_long uVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  iterator begin;
  unsigned_long tmp;
  unsigned_long sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *counts_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__,counts);
  tmp = 0;
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(__return_storage_ptr__);
  while( true ) {
    local_40._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
    bVar3 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar3) break;
    begin._M_current = (unsigned_long *)tmp;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_38);
    uVar1 = *puVar4;
    uVar5 = std::numeric_limits<unsigned_long>::max();
    if (uVar5 <= tmp + uVar1) {
      assert_fail("(std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                  ,0x3a,"get_displacements");
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_38);
    iVar2 = begin;
    tmp = *puVar4 + tmp;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_38);
    *puVar4 = (unsigned_long)iVar2._M_current;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> get_displacements(const std::vector<index_t>& counts)
{
    // copy and do an exclusive prefix sum
    std::vector<index_t> result(counts);
    // set the total sum to zero
    index_t sum = 0;
    index_t tmp;

    // calculate the exclusive prefix sum
    typename std::vector<index_t>::iterator begin = result.begin();
    while (begin != result.end())
    {
        tmp = sum;
        // assert that the sum will still fit into the index type (MPI default:
        // int)
        MXX_ASSERT((std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max());
        sum += *begin;
        *begin = tmp;
        ++begin;
    }
    return result;
}